

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlAddChildList(xmlNodePtr parent,xmlNodePtr cur)

{
  xmlNodePtr text;
  bool bVar1;
  int iVar2;
  xmlNodePtr next;
  int oom;
  xmlNodePtr prev;
  xmlNodePtr iter;
  xmlNodePtr cur_local;
  xmlNodePtr parent_local;
  
  if ((parent == (xmlNodePtr)0x0) || (parent->type == XML_NAMESPACE_DECL)) {
    parent_local = (xmlNodePtr)0x0;
  }
  else if ((cur == (xmlNodePtr)0x0) || (cur->type == XML_NAMESPACE_DECL)) {
    parent_local = (xmlNodePtr)0x0;
  }
  else {
    bVar1 = false;
    for (prev = cur; prev != (xmlNodePtr)0x0; prev = prev->next) {
      if ((prev->doc != parent->doc) && (iVar2 = xmlSetTreeDoc(prev,parent->doc), iVar2 < 0)) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      parent_local = (xmlNodePtr)0x0;
    }
    else {
      iter = cur;
      if (parent->children == (_xmlNode *)0x0) {
        parent->children = cur;
      }
      else {
        text = parent->last;
        if (((cur->type == XML_TEXT_NODE) && (text->type == XML_TEXT_NODE)) &&
           (cur->name == text->name)) {
          iVar2 = xmlTextAddContent(text,cur->content,-1);
          if (iVar2 < 0) {
            return (xmlNodePtr)0x0;
          }
          iter = cur->next;
          xmlFreeNode(cur);
          if (iter == (_xmlNode *)0x0) {
            return text;
          }
        }
        text->next = iter;
        iter->prev = text;
      }
      for (; iter->next != (_xmlNode *)0x0; iter = iter->next) {
        iter->parent = parent;
      }
      iter->parent = parent;
      parent->last = iter;
      parent_local = iter;
    }
  }
  return parent_local;
}

Assistant:

xmlNodePtr
xmlAddChildList(xmlNodePtr parent, xmlNodePtr cur) {
    xmlNodePtr iter;
    xmlNodePtr prev;
    int oom;

    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL)) {
	return(NULL);
    }

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
	return(NULL);
    }

    oom = 0;
    for (iter = cur; iter != NULL; iter = iter->next) {
	if (iter->doc != parent->doc) {
	    if (xmlSetTreeDoc(iter, parent->doc) < 0)
                oom = 1;
	}
    }
    if (oom)
        return(NULL);

    /*
     * add the first element at the end of the children list.
     */

    if (parent->children == NULL) {
        parent->children = cur;
    } else {
        prev = parent->last;

	/*
	 * If cur and parent->last both are TEXT nodes, then merge them.
	 */
	if ((cur->type == XML_TEXT_NODE) &&
	    (prev->type == XML_TEXT_NODE) &&
	    (cur->name == prev->name)) {
            xmlNodePtr next;

            if (xmlTextAddContent(prev, cur->content, -1) < 0)
                return(NULL);
            next = cur->next;
	    xmlFreeNode(cur);
	    /*
	     * if it's the only child, nothing more to be done.
	     */
	    if (next == NULL)
		return(prev);
	    cur = next;
	}

	prev->next = cur;
	cur->prev = prev;
    }
    while (cur->next != NULL) {
	cur->parent = parent;
        cur = cur->next;
    }
    cur->parent = parent;
    parent->last = cur;

    return(cur);
}